

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-light.c
# Opt level: O1

_Bool borg_check_light(void)

{
  _Bool _Var1;
  byte bVar2;
  byte bVar3;
  _Bool _Var4;
  byte bVar5;
  byte bVar6;
  _Bool _Var7;
  int iVar8;
  borg_grid *pbVar9;
  wchar_t wVar10;
  wchar_t wVar11;
  _Bool _Var12;
  _Bool _Var13;
  wchar_t wVar14;
  wchar_t wVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  bool bVar24;
  
  wVar11 = w_x;
  if (((((10 < borg.trait[0x24]) && (borg.trait[0x69] == 0)) || (borg.trait[0x70] != 0)) ||
      ((borg.trait[0x72] != 0 || (borg.trait[0x78] != 0)))) ||
     ((borg.trait[0x73] != 0 || (borg.trait[0x74] != 0)))) {
    return false;
  }
  if (borg.trait[0x6c] != 0) {
    return false;
  }
  wVar14 = borg_panel_wid();
  wVar10 = w_y;
  wVar15 = borg_panel_hgt();
  lVar19 = (long)(wVar10 / wVar15);
  lVar16 = (long)(wVar11 / wVar14);
  lVar17 = lVar19 * 0x12;
  bVar23 = borg_detect_trap[lVar19][lVar16] & borg_detect_trap[lVar19][lVar16 + 1] &
           *(byte *)(lVar16 + lVar17 + 0x3071f2) & *(byte *)(lVar16 + 1 + lVar17 + 0x3071f2);
  bVar21 = borg_detect_door[lVar19][lVar16] ^ 1;
  if ((borg_detect_door[lVar19][lVar16 + 1] & 1U) == 0) {
    bVar21 = 1;
  }
  if ((*(byte *)(lVar16 + 1 + lVar17 + 0x3072d2) & *(byte *)(lVar16 + lVar17 + 0x3072d2)) == 0) {
    bVar21 = 1;
  }
  _Var13 = borg_detect_wall[lVar19][lVar16];
  _Var1 = borg_detect_wall[lVar19][lVar16 + 1];
  bVar2 = *(byte *)(lVar16 + lVar17 + 0x307262);
  bVar3 = *(byte *)(lVar16 + 1 + lVar17 + 0x307262);
  bVar22 = borg_detect_evil[lVar19][lVar16] ^ 1;
  if ((borg_detect_evil[lVar19][lVar16 + 1] & 1U) == 0) {
    bVar22 = 1;
  }
  if ((*(byte *)(lVar16 + 1 + lVar17 + 0x307342) & *(byte *)(lVar16 + lVar17 + 0x307342)) == 0) {
    bVar22 = 1;
  }
  _Var4 = borg_detect_obj[lVar19][lVar16];
  bVar5 = *(byte *)(lVar16 + lVar17 + 0x3073c2);
  bVar6 = *(byte *)(lVar16 + 1 + lVar17 + 0x3073c2);
  bVar20 = 0;
  if (borg.trait[0x25] == 0) {
    bVar20 = bVar22;
  }
  _Var7 = borg_detect_obj[lVar19][lVar16 + 1];
  iVar8 = borg.trait[0x69];
  bVar24 = iVar8 == 0;
  if (bVar24) {
    bVar21 = 0;
  }
  if ((((bVar23 & 1) == 0 && !bVar24) || ((bVar21 & 1) != 0)) || ((bVar20 & 1) != 0)) {
    if ((borg.when_detect_traps == 0) ||
       (iVar18 = (int)borg_t, borg.when_detect_evil == 0 || 4 < iVar18 - borg.when_detect_traps)) {
      if (iVar8 != 0) goto LAB_00232f77;
      goto LAB_00232ffe;
    }
    if ((iVar8 == 0) ||
       (iVar18 - borg.when_detect_evil < 5 &&
        (iVar18 - borg.when_detect_doors < 5 && borg.when_detect_doors != 0))) goto LAB_00232ffe;
LAB_00232f77:
    _Var12 = borg_activate_item(act_detect_all);
    if ((!_Var12) &&
       (((_Var12 = borg_activate_item(act_mapping), !_Var12 &&
         (_Var12 = borg_zap_rod(sv_rod_detection), !_Var12)) &&
        (_Var12 = borg_spell_fail(SENSE_SURROUNDINGS,L'('), !_Var12)))) goto LAB_00232ffe;
    borg_note("# Checking for traps, doors, and evil.");
    borg_react("SELF:TDE","SELF:TDE");
    borg.when_detect_traps = borg_t;
    borg.when_detect_doors = borg_t;
    borg.when_detect_evil = borg_t;
LAB_00232ff4:
    borg.when_detect_obj = borg_t;
  }
  else {
LAB_00232ffe:
    if ((((bVar20 & 1) != 0) &&
        ((borg.when_detect_evil == 0 || (0x13 < (int)borg_t - (int)borg.when_detect_evil)))) &&
       ((_Var12 = borg_spell_fail(DETECT_EVIL,L'('), _Var12 ||
        (((_Var12 = borg_spell_fail(DETECT_MONSTERS,L'('), _Var12 ||
          (_Var12 = borg_spell_fail(READ_MINDS,L'('), _Var12)) ||
         (_Var12 = borg_spell_fail(SEEK_BATTLE,L'('), _Var12)))))) {
      borg_note("# Checking for monsters.");
      borg_react("SELF:evil","SELF:evil");
      borg.when_detect_evil = borg_t;
      return true;
    }
    if (((((bVar23 & 1) != 0 || bVar24) && ((bVar21 & 1) == 0)) ||
        (((borg.when_detect_traps != 0 &&
          (((int)borg_t - (int)borg.when_detect_doors < 5 &&
           (int)borg_t - (int)borg.when_detect_traps < 5) && borg.when_detect_doors != 0)) ||
         (borg.trait[0x69] == 0)))) ||
       ((((_Var12 = borg_activate_item(act_detect_all), !_Var12 &&
          (_Var12 = borg_activate_item(act_mapping), !_Var12)) &&
         (_Var12 = borg_spell_fail(DETECTION,L'('), !_Var12)) &&
        ((_Var12 = borg_spell_fail(FIND_TRAPS_DOORS_STAIRS,L'('), !_Var12 &&
         (_Var12 = borg_spell_fail(DETECT_STAIRS,L'('), !_Var12)))))) {
      if ((((bVar23 & 1) == 0 && !bVar24) &&
          ((borg.when_detect_traps == 0 || (6 < (int)borg_t - (int)borg.when_detect_traps)))) &&
         ((borg.trait[0x69] != 0 &&
          ((_Var12 = borg_spell_fail(DETECTION,L'('), _Var12 ||
           (_Var12 = borg_spell_fail(FIND_TRAPS_DOORS_STAIRS,L'('), _Var12)))))) {
        borg_note("# Checking for traps.");
        borg_react("SELF:trap","SELF:trap");
        borg.when_detect_traps = borg_t;
        return true;
      }
      if ((((bVar21 & 1) == 0) ||
          (((borg.when_detect_doors != 0 && ((int)borg_t - (int)borg.when_detect_doors < 9)) ||
           (borg.trait[0x69] == 0)))) ||
         ((((_Var12 = borg_activate_item(act_detect_all), !_Var12 &&
            (_Var12 = borg_activate_item(act_mapping), !_Var12)) &&
           (_Var12 = borg_spell_fail(DETECTION,L'('), !_Var12)) &&
          (_Var12 = borg_spell_fail(FIND_TRAPS_DOORS_STAIRS,L'('), !_Var12)))) {
        if ((((!bVar24 && (_Var1 & _Var13 & bVar3 & bVar2 & 1) == 0) &&
             ((borg.when_detect_walls == 0 || (0xe < (int)borg_t - (int)borg.when_detect_walls))))
            && (borg.trait[0x69] != 0)) &&
           ((((_Var13 = borg_activate_item(act_mapping), _Var13 ||
              (_Var13 = borg_read_scroll(sv_scroll_mapping), _Var13)) ||
             (_Var13 = borg_use_staff(sv_staff_mapping), _Var13)) ||
            ((_Var13 = borg_zap_rod(sv_rod_mapping), _Var13 ||
             (_Var13 = borg_spell(SENSE_SURROUNDINGS), _Var13)))))) {
          borg_note("# Checking for walls.");
          borg_react("SELF:wall","SELF:wall");
          borg.when_detect_walls = borg_t;
          lVar17 = 0;
          do {
            pbVar9 = borg_grids[lVar17];
            lVar16 = 2;
            do {
              (&pbVar9->field_0x1)[lVar16] = (&pbVar9->field_0x1)[lVar16] & 0xfe;
              lVar16 = lVar16 + 0xc;
            } while (lVar16 != 0x94a);
            lVar17 = lVar17 + 1;
          } while (lVar17 != 0x42);
          return true;
        }
        if ((((byte)(bVar5 & bVar6 & _Var7 & _Var4) != 0) ||
            ((borg.when_detect_obj != 0 && ((int)borg_t - (int)borg.when_detect_obj < 0x14)))) ||
           ((_Var13 = borg_activate_item(act_detect_objects), !_Var13 &&
            (_Var13 = borg_spell_fail(OBJECT_DETECTION,L'('), !_Var13)))) {
          _Var13 = borg_check_light_only();
          return _Var13;
        }
        borg_note("# Checking for objects.");
        borg_react("SELF:obj","SELF:obj");
        goto LAB_00232ff4;
      }
      borg_note("# Checking for doors.");
      borg_react("SELF:door","SELF:door");
    }
    else {
      borg_note("# Checking for traps, doors & stairs.");
      borg_react("SELF:both","SELF:both");
      borg.when_detect_traps = borg_t;
    }
    borg.when_detect_doors = borg_t;
  }
  return true;
}

Assistant:

bool borg_check_light(void)
{
    int q_x, q_y;

    bool do_trap;
    bool do_door;
    bool do_wall;
    bool do_evil;
    bool do_obj;

    /* Never in town when mature (scary guy)*/
    if (borg.trait[BI_MAXCLEVEL] > 10 && !borg.trait[BI_CDEPTH])
        return false;

    /* Never when compromised, save your mana */
    if (borg.trait[BI_ISBLIND] 
        || borg.trait[BI_ISCONFUSED]
        || borg.trait[BI_ISIMAGE] 
        || borg.trait[BI_ISPOISONED]
        || borg.trait[BI_ISCUT] 
        || borg.trait[BI_ISWEAK])
        return false;

    /* XXX XXX XXX Dark */

    /* Extract the panel */
    q_x = w_x / borg_panel_wid();
    q_y = w_y / borg_panel_hgt();

    /* Start */
    do_trap = false;

    /* Determine if we need to detect traps */
    if (!borg_detect_trap[q_y + 0][q_x + 0])
        do_trap = true;
    if (!borg_detect_trap[q_y + 0][q_x + 1])
        do_trap = true;
    if (!borg_detect_trap[q_y + 1][q_x + 0])
        do_trap = true;
    if (!borg_detect_trap[q_y + 1][q_x + 1])
        do_trap = true;

    /* Hack -- check traps every few turns anyway */
    /* if (!when_detect_traps || (borg_t - when_detect_traps >= 183)) do_trap =
     * true; */

    /* Start */
    do_door = false;

    /* Determine if we need to detect doors */
    if (!borg_detect_door[q_y + 0][q_x + 0])
        do_door = true;
    if (!borg_detect_door[q_y + 0][q_x + 1])
        do_door = true;
    if (!borg_detect_door[q_y + 1][q_x + 0])
        do_door = true;
    if (!borg_detect_door[q_y + 1][q_x + 1])
        do_door = true;

    /* Hack -- check doors every few turns anyway */
    /* if (!when_detect_doors || (borg_t - when_detect_doors >= 731)) do_door =
     * true; */

    /* Start */
    do_wall = false;

    /* Determine if we need to detect walls */
    if (!borg_detect_wall[q_y + 0][q_x + 0])
        do_wall = true;
    if (!borg_detect_wall[q_y + 0][q_x + 1])
        do_wall = true;
    if (!borg_detect_wall[q_y + 1][q_x + 0])
        do_wall = true;
    if (!borg_detect_wall[q_y + 1][q_x + 1])
        do_wall = true;

    /* Hack -- check walls every few turns anyway */
    /* if (!when_detect_walls || (borg_t - when_detect_walls >= 937)) do_wall =
     * true; */

    /* Start */
    do_evil = false;

    /* Determine if we need to detect evil */
    if (!borg_detect_evil[q_y + 0][q_x + 0])
        do_evil = true;
    if (!borg_detect_evil[q_y + 0][q_x + 1])
        do_evil = true;
    if (!borg_detect_evil[q_y + 1][q_x + 0])
        do_evil = true;
    if (!borg_detect_evil[q_y + 1][q_x + 1])
        do_evil = true;

    /* Start */
    do_obj = false;

    /* Determine if we need to detect evil */
    if (!borg_detect_obj[q_y + 0][q_x + 0])
        do_obj = true;
    if (!borg_detect_obj[q_y + 0][q_x + 1])
        do_obj = true;
    if (!borg_detect_obj[q_y + 1][q_x + 0])
        do_obj = true;
    if (!borg_detect_obj[q_y + 1][q_x + 1])
        do_obj = true;

    /* Hack -- check evil every few turns anyway- more fq if low level */
    /* if (!when_detect_evil ||
       (borg_t - when_detect_evil  >= 183 - (80 - borg.trait[BI_MAXCLEVEL])))
       do_evil = true; */

    /* Really low level */
    /* if (borg.trait[BI_CLEVEL] <= 3 &&
        (!when_detect_evil ||
        (borg_t - when_detect_evil  >= 50))) do_evil = true; */

    /* Not too frequent in town */
    /* if (borg.trait[BI_CDEPTH] == 0 &&
        (!when_detect_evil ||
        (borg_t - when_detect_evil  >= 250))) do_evil = true; */

    /* Dont bother if I have ESP */
    if (borg.trait[BI_ESP])
        do_evil = false;

    /* Only look for monsters in town, not walls, etc (scary guy)*/
    if (!borg.trait[BI_CDEPTH]) {
        do_trap = false;
        do_door = false;
        do_wall = false;
    }

    /*** Do Things ***/

    /* Hack -- find traps and doors and evil*/
    if ((do_trap || do_door || do_evil)
        && ((!borg.when_detect_traps || (borg_t - borg.when_detect_traps >= 5))
            || (!borg.when_detect_evil || (borg_t - borg.when_detect_evil >= 5))
            || (!borg.when_detect_doors
                || (borg_t - borg.when_detect_doors >= 5)))
        && borg.trait[BI_CDEPTH]) /* Never in town */
    {

        /* Check for traps and doors and evil*/
        if (borg_activate_item(act_detect_all)
            || borg_activate_item(act_mapping) 
            || borg_zap_rod(sv_rod_detection)
            || borg_spell_fail(SENSE_SURROUNDINGS, 40)) {
            borg_note("# Checking for traps, doors, and evil.");

            borg_react("SELF:TDE", "SELF:TDE");

            borg.when_detect_traps = borg_t;
            borg.when_detect_doors = borg_t;
            borg.when_detect_evil  = borg_t;
            borg.when_detect_obj   = borg_t;

            return true;
        }
    }

    /* Hack -- find evil */
    if (do_evil
        && (!borg.when_detect_evil || (borg_t - borg.when_detect_evil >= 20))) {
        /* Check for evil */
        if (borg_spell_fail(DETECT_EVIL, 40)
            || borg_spell_fail(DETECT_MONSTERS, 40)
            || borg_spell_fail(READ_MINDS, 40)
            || borg_spell_fail(SEEK_BATTLE, 40)) {
            borg_note("# Checking for monsters.");

            borg_react("SELF:evil", "SELF:evil");

            borg.when_detect_evil = borg_t;

            return true;
        }
    }

    /* Hack -- find traps and doors (and stairs) */
    if ((do_trap || do_door)
        && ((!borg.when_detect_traps || (borg_t - borg.when_detect_traps >= 5))
            || (!borg.when_detect_doors
                || (borg_t - borg.when_detect_doors >= 5)))
        && borg.trait[BI_CDEPTH]) /* Never in town */
    {
        /* Check for traps and doors */
        if (borg_activate_item(act_detect_all)
            || borg_activate_item(act_mapping) 
            || borg_spell_fail(DETECTION, 40)
            || borg_spell_fail(FIND_TRAPS_DOORS_STAIRS, 40)
            || borg_spell_fail(DETECT_STAIRS, 40)) {
            borg_note("# Checking for traps, doors & stairs.");

            borg_react("SELF:both", "SELF:both");

            borg.when_detect_traps = borg_t;
            borg.when_detect_doors = borg_t;

            return true;
        }
    }

    /* Hack -- find traps */
    if (do_trap
        && (!borg.when_detect_traps || (borg_t - borg.when_detect_traps >= 7))
        && borg.trait[BI_CDEPTH]) /* Never in town */
    {
        /* Check for traps */
        if (borg_spell_fail(DETECTION, 40)
            || borg_spell_fail(FIND_TRAPS_DOORS_STAIRS, 40)) {
            borg_note("# Checking for traps.");

            borg_react("SELF:trap", "SELF:trap");

            borg.when_detect_traps = borg_t;

            return true;
        }
    }

    /* Hack -- find doors */
    if (do_door
        && (!borg.when_detect_doors || (borg_t - borg.when_detect_doors >= 9))
        && borg.trait[BI_CDEPTH]) /* Never in town */
    {
        /* Check for traps */
        if (borg_activate_item(act_detect_all)
            || borg_activate_item(act_mapping) || borg_spell_fail(DETECTION, 40)
            || borg_spell_fail(FIND_TRAPS_DOORS_STAIRS, 40)) {
            borg_note("# Checking for doors.");

            borg_react("SELF:door", "SELF:door");

            borg.when_detect_doors = borg_t;

            return true;
        }
    }

    /* Hack -- find walls */
    if (do_wall
        && (!borg.when_detect_walls || (borg_t - borg.when_detect_walls >= 15))
        /* Never in town */
        && borg.trait[BI_CDEPTH]) {
        /* Check for walls */
        if (borg_activate_item(act_mapping)
            || borg_read_scroll(sv_scroll_mapping)
            || borg_use_staff(sv_staff_mapping) || borg_zap_rod(sv_rod_mapping)
            || borg_spell(SENSE_SURROUNDINGS)) {
            int y, x;

            borg_note("# Checking for walls.");

            borg_react("SELF:wall", "SELF:wall");

            borg.when_detect_walls = borg_t;

            /*
             * Clear the BORG_IGNORE_MAP flag:  immediately after detection
             * want to use the map's information rather than what the borg
             * remembers.
             */
            for (y = 0; y < AUTO_MAX_Y; ++y) {
                for (x = 0; x < AUTO_MAX_X; ++x) {
                    borg_grids[y][x].info &= ~BORG_IGNORE_MAP;
                }
            }
            return true;
        }
    }

    /* Hack -- find objects */
    if (do_obj
        && (!borg.when_detect_obj || (borg_t - borg.when_detect_obj >= 20))) {
        /* Check for objects */
        if (borg_activate_item(act_detect_objects)
            || borg_spell_fail(OBJECT_DETECTION, 40)) {
            borg_note("# Checking for objects.");

            borg_react("SELF:obj", "SELF:obj");

            borg.when_detect_obj = borg_t;

            return true;
        }
    }

    /* Do the actual illumination bit */
    return borg_check_light_only();
}